

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

void __thiscall
helics::TimeCoordinator::sendTimeRequest(TimeCoordinator *this,GlobalFederateId triggerFed)

{
  int iVar1;
  long lVar2;
  ushort uVar3;
  pair<bool,_bool> pVar4;
  long lVar5;
  DependencyInfo *pDVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ActionMessage local_d0;
  
  ActionMessage::ActionMessage(&local_d0,cmd_time_request);
  local_d0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
  lVar8 = (this->time_next).internalTimeCode;
  local_d0.counter = (uint16_t)(this->super_BaseTimeCoordinator).sequenceCounter;
  if ((this->super_BaseTimeCoordinator).nonGranting == true) {
    local_d0.flags = local_d0.flags | 0x80;
  }
  uVar3 = 0x400;
  if (((this->info).wait_for_current_time_updates != false) ||
     (uVar3 = 0x100, lVar8 < (this->time_requested).internalTimeCode)) {
    local_d0.flags = local_d0.flags | uVar3;
  }
  lVar9 = (this->time_exec).internalTimeCode;
  lVar5 = (this->info).outputDelay.internalTimeCode;
  lVar7 = 0x7fffffffffffffff - lVar5;
  local_d0.Te.internalTimeCode = lVar5 + lVar9;
  if (lVar7 <= lVar9) {
    local_d0.Te.internalTimeCode = 0x7fffffffffffffff;
  }
  local_d0.actionTime.internalTimeCode = lVar8;
  if ((this->globalTime == false) &&
     (((this->info).event_triggered != false ||
      ((this->time_requested).internalTimeCode == 0x7fffffffffffffff)))) {
    lVar2 = (this->upstream).Te.internalTimeCode;
    lVar9 = lVar2 + lVar5;
    if (lVar7 <= lVar2) {
      lVar9 = 0x7fffffffffffffff;
    }
    if (local_d0.Te.internalTimeCode <= lVar9) {
      lVar9 = local_d0.Te.internalTimeCode;
    }
    local_d0.Te.internalTimeCode = 0;
    if (0 < lVar9) {
      local_d0.Te.internalTimeCode = lVar9;
    }
    local_d0.actionTime.internalTimeCode = local_d0.Te.internalTimeCode;
    if (lVar8 <= local_d0.Te.internalTimeCode) {
      local_d0.actionTime.internalTimeCode = lVar8;
    }
  }
  lVar8 = (this->upstream).Te.internalTimeCode;
  local_d0.Tdemin.internalTimeCode = lVar8 + lVar5;
  if (lVar7 <= lVar8) {
    local_d0.Tdemin.internalTimeCode = 0x7fffffffffffffff;
  }
  if (local_d0.Te.internalTimeCode < local_d0.Tdemin.internalTimeCode) {
    local_d0.Tdemin.internalTimeCode = local_d0.Te.internalTimeCode;
  }
  if ((this->globalTime == false) &&
     (((this->info).event_triggered != false ||
      ((this->time_requested).internalTimeCode == 0x7fffffffffffffff)))) {
    lVar8 = (this->upstream).minDe.internalTimeCode;
    lVar5 = lVar5 + lVar8;
    if (lVar7 <= lVar8) {
      lVar5 = 0x7fffffffffffffff;
    }
    if (local_d0.Tdemin.internalTimeCode <= lVar5) {
      lVar5 = local_d0.Tdemin.internalTimeCode;
    }
    local_d0.Tdemin.internalTimeCode = 0;
    if (0 < lVar5) {
      local_d0.Tdemin.internalTimeCode = lVar5;
    }
    if (local_d0.Tdemin.internalTimeCode < local_d0.actionTime.internalTimeCode) {
      local_d0.actionTime.internalTimeCode = local_d0.Tdemin.internalTimeCode;
    }
  }
  local_d0.dest_handle.hid = (this->upstream).minFed.gid;
  if (local_d0.Tdemin.internalTimeCode < local_d0.actionTime.internalTimeCode) {
    local_d0.Tdemin.internalTimeCode = local_d0.actionTime.internalTimeCode;
  }
  if (this->iterating != NO_ITERATIONS) {
    setIterationFlags(&local_d0,this->iterating);
  }
  local_d0.counter = (uint16_t)(this->super_BaseTimeCoordinator).sequenceCounter;
  if (this->triggered == true) {
    local_d0.flags = local_d0.flags | 2;
  }
  pVar4 = checkAndSendTimeRequest(this,&local_d0,(GlobalFederateId)(this->upstream).minFed.gid);
  if (((ushort)pVar4 & 1) == 0) {
    if (((triggerFed.gid != -2010000000) && (triggerFed.gid != -1700000000)) &&
       (local_d0.dest_id.gid = triggerFed.gid,
       pDVar6 = TimeDependencies::getDependencyInfo
                          (&(this->super_BaseTimeCoordinator).dependencies,triggerFed),
       pDVar6->dependent == true)) {
      local_d0.source_handle.hid = (pDVar6->super_TimeData).sequenceCounter;
      if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager ==
          (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&local_d0);
    }
  }
  else if (((((ushort)pVar4 >> 8 & 1) != 0) &&
           (iVar1 = (this->upstream).minFed.gid, iVar1 != -2010000000)) && (iVar1 != -1700000000)) {
    local_d0.dest_handle.hid = -2010000000;
    local_d0.source_handle.hid = (this->upstream).responseSequenceCounter;
    if ((this->globalTime == false) &&
       (((this->info).event_triggered != false ||
        ((this->time_requested).internalTimeCode == 0x7fffffffffffffff)))) {
      lVar9 = (this->time_exec).internalTimeCode;
      lVar5 = (this->info).outputDelay.internalTimeCode;
      lVar8 = lVar5 + lVar9;
      if (0x7fffffffffffffff - lVar5 <= lVar9) {
        lVar8 = 0x7fffffffffffffff;
      }
      lVar9 = (this->upstream).TeAlt.internalTimeCode;
      local_d0.Te.internalTimeCode = lVar5 + lVar9;
      if (0x7fffffffffffffff - lVar5 <= lVar9) {
        local_d0.Te.internalTimeCode = 0x7fffffffffffffff;
      }
      if (lVar8 <= local_d0.Te.internalTimeCode) {
        local_d0.Te.internalTimeCode = lVar8;
      }
    }
    local_d0.Tdemin.internalTimeCode = (this->upstream).TeAlt.internalTimeCode;
    if (local_d0.Te.internalTimeCode < local_d0.Tdemin.internalTimeCode) {
      local_d0.Tdemin.internalTimeCode = local_d0.Te.internalTimeCode;
    }
    local_d0.dest_id.gid = iVar1;
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
              ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&local_d0);
  }
  ActionMessage::~ActionMessage(&local_d0);
  return;
}

Assistant:

void TimeCoordinator::sendTimeRequest(GlobalFederateId triggerFed) const
{
    ActionMessage upd(CMD_TIME_REQUEST);
    upd.source_id = mSourceId;
    upd.actionTime = time_next;
    upd.counter = sequenceCounter;
    if (nonGranting) {
        setActionFlag(upd, non_granting_flag);
    }
    if (info.wait_for_current_time_updates) {
        setActionFlag(upd, delayed_timing_flag);
    } else if (time_requested > time_next) {
        setActionFlag(upd, interrupted_flag);
    }
    upd.Te = checkAdd(time_exec, info.outputDelay);
    if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
        upd.Te = std::min(upd.Te, checkAdd(upstream.Te, info.outputDelay));
        if (upd.Te < timeZero) {
            upd.Te = timeZero;
        }
        upd.actionTime = std::min(upd.actionTime, upd.Te);
    }
    upd.Tdemin = std::min(checkAdd(upstream.Te, info.outputDelay), upd.Te);
    if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
        upd.Tdemin = std::min(upd.Tdemin, checkAdd(upstream.minDe, info.outputDelay));
        if (upd.Tdemin < timeZero) {
            upd.Tdemin = timeZero;
        }
        if (upd.Tdemin < upd.actionTime) {
            upd.actionTime = upd.Tdemin;
        }
    }
    upd.setExtraData(upstream.minFed.baseValue());

    if (upd.Tdemin < upd.actionTime) {
        upd.Tdemin = upd.actionTime;
    }

    if (iterating != IterationRequest::NO_ITERATIONS) {
        setIterationFlags(upd, iterating);
    }
    upd.counter = sequenceCounter;
    if (triggered) {
        setActionFlag(upd, destination_target);
    }
    auto check = checkAndSendTimeRequest(upd, upstream.minFed);
    if (check.first) {
        if (check.second) {
            if (upstream.minFed.isValid()) {
                upd.dest_id = upstream.minFed;
                upd.setExtraData(GlobalFederateId{}.baseValue());
                upd.setExtraDestData(upstream.responseSequenceCounter);
                if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
                    upd.Te = checkAdd(time_exec, info.outputDelay);
                    upd.Te = std::min(upd.Te, checkAdd(upstream.TeAlt, info.outputDelay));
                }
                upd.Tdemin = std::min(upstream.TeAlt, upd.Te);
                sendMessageFunction(upd);
            }
        }
    } else if (triggerFed.isValid()) {
        upd.dest_id = triggerFed;
        const auto* dep = dependencies.getDependencyInfo(triggerFed);
        if (dep->dependent) {
            upd.setExtraDestData(dep->sequenceCounter);
            sendMessageFunction(upd);
        }
    }

    //    printf("%d next=%f, exec=%f, Tdemin=%f\n", mSourceId, static_cast<double>(time_next),
    // static_cast<double>(time_exec), static_cast<double>(time_minDe));
}